

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# valid.c
# Opt level: O0

void xmlValidateCheckRefCallback(void *payload,void *data,xmlChar *name)

{
  void *local_40;
  xmlValidateMemo memo;
  xmlValidCtxtPtr ctxt;
  xmlListPtr ref_list;
  xmlChar *name_local;
  void *data_local;
  void *payload_local;
  
  if (payload != (void *)0x0) {
    local_40 = data;
    memo.ctxt = (xmlValidCtxtPtr)name;
    memo.name = (xmlChar *)data;
    xmlListWalk((xmlListPtr)payload,xmlWalkValidateList,&local_40);
  }
  return;
}

Assistant:

static void
xmlValidateCheckRefCallback(void *payload, void *data, const xmlChar *name) {
    xmlListPtr ref_list = (xmlListPtr) payload;
    xmlValidCtxtPtr ctxt = (xmlValidCtxtPtr) data;
    xmlValidateMemo memo;

    if (ref_list == NULL)
	return;
    memo.ctxt = ctxt;
    memo.name = name;

    xmlListWalk(ref_list, xmlWalkValidateList, &memo);

}